

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Abc_Obj_t *
Abc_NtkSpecialMuxTree_rec(Abc_Ntk_t *pNew,Abc_Obj_t **pCtrl,int nCtrl,Abc_Obj_t **pData,int Shift)

{
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pLit1;
  Abc_Obj_t *pLit0;
  int Shift_local;
  Abc_Obj_t **pData_local;
  int nCtrl_local;
  Abc_Obj_t **pCtrl_local;
  Abc_Ntk_t *pNew_local;
  
  if (nCtrl == 0) {
    pNew_local = (Abc_Ntk_t *)pData[Shift];
  }
  else {
    pNode0 = Abc_NtkSpecialMuxTree_rec(pNew,pCtrl,nCtrl + -1,pData,Shift);
    pNode1 = Abc_NtkSpecialMuxTree_rec
                       (pNew,pCtrl,nCtrl + -1,pData,Shift + (1 << ((char)nCtrl - 1U & 0x1f)));
    pNew_local = (Abc_Ntk_t *)Abc_NtkCreateNodeMux(pNew,pCtrl[nCtrl + -1],pNode1,pNode0);
  }
  return (Abc_Obj_t *)pNew_local;
}

Assistant:

Abc_Obj_t * Abc_NtkSpecialMuxTree_rec( Abc_Ntk_t * pNew, Abc_Obj_t ** pCtrl, int nCtrl, Abc_Obj_t ** pData, int Shift )
{
    Abc_Obj_t * pLit0, * pLit1;
    if ( nCtrl == 0 )
        return pData[Shift];
    pLit0 = Abc_NtkSpecialMuxTree_rec( pNew, pCtrl, nCtrl-1, pData, Shift );
    pLit1 = Abc_NtkSpecialMuxTree_rec( pNew, pCtrl, nCtrl-1, pData, Shift + (1<<(nCtrl-1)) );
    return Abc_NtkCreateNodeMux( pNew, pCtrl[nCtrl-1], pLit1, pLit0 );
}